

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-strtod.cpp
# Opt level: O2

float __thiscall
icu_63::double_conversion::Strtof(double_conversion *this,Vector<const_char> buffer,int exponent)

{
  undefined1 auVar1 [12];
  bool bVar2;
  int iVar3;
  double_conversion **guess;
  float fVar4;
  double dVar5;
  float fVar6;
  float fVar7;
  Vector<const_char> trimmed_00;
  Vector<const_char> buffer_00;
  Vector<const_char> buffer_01;
  DiyFp DVar8;
  int updated_exponent;
  double double_guess;
  Vector<const_char> trimmed;
  char copy_buffer [780];
  undefined4 in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc8c;
  Double local_368;
  double local_360;
  undefined1 local_354 [12];
  double_conversion *local_348;
  uint local_340;
  char local_338 [784];
  
  buffer_00._8_8_ = buffer.start_;
  guess = &local_348;
  local_348 = (double_conversion *)0x0;
  local_340 = 0;
  buffer_00.start_ = (char *)this;
  TrimAndCut(buffer_00,buffer.length_,local_338,(int)guess,(Vector<const_char> *)local_354,
             (int *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  buffer_01.length_ = local_340;
  buffer_01.start_ = (char *)local_348;
  trimmed_00.start_ = (ulong)local_340;
  trimmed_00.length_ = local_354._0_4_;
  trimmed_00._12_4_ = 0;
  bVar2 = ComputeGuess(local_348,trimmed_00,(int)local_354 + 4,(double *)guess);
  fVar4 = (float)(double)local_354._4_8_;
  if (((double)local_354._4_8_ != (double)fVar4) ||
     (NAN((double)local_354._4_8_) || NAN((double)fVar4))) {
    local_368.d64_ = local_354._4_8_;
    local_360 = Double::NextDouble(&local_368);
    local_368.d64_ = local_354._4_8_;
    dVar5 = Double::PreviousDouble(&local_368);
    fVar6 = (float)dVar5;
    dVar5 = local_360;
    if (!bVar2) {
      local_368.d64_ = (uint64_t)local_360;
      dVar5 = Double::NextDouble(&local_368);
    }
    fVar7 = (float)dVar5;
    if ((fVar6 != fVar7) || (NAN(fVar6) || NAN(fVar7))) {
      if ((fVar6 != 0.0) || (NAN(fVar6))) {
        local_368.d64_._0_4_ = fVar6;
        DVar8 = Single::UpperBoundary((Single *)&local_368);
        auVar1 = DVar8._0_12_;
      }
      else {
        local_368.d64_ = 0x3690000000000000;
        DVar8 = Double::AsDiyFp(&local_368);
        auVar1 = DVar8._0_12_;
      }
      buffer_01._12_4_ = 0;
      DVar8._12_4_ = 0;
      DVar8.f_ = auVar1._0_8_;
      DVar8.e_ = auVar1._8_4_;
      iVar3 = CompareBufferWithDiyFp(buffer_01,local_354._0_4_,DVar8);
      fVar4 = fVar6;
      if ((-1 < iVar3) && ((iVar3 != 0 || (((uint)fVar6 & 1) != 0)))) {
        fVar4 = fVar7;
      }
    }
  }
  return fVar4;
}

Assistant:

float Strtof(Vector<const char> buffer, int exponent) {
  char copy_buffer[kMaxSignificantDecimalDigits];
  Vector<const char> trimmed;
  int updated_exponent;
  TrimAndCut(buffer, exponent, copy_buffer, kMaxSignificantDecimalDigits,
             &trimmed, &updated_exponent);
  exponent = updated_exponent;

  double double_guess;
  bool is_correct = ComputeGuess(trimmed, exponent, &double_guess);

  float float_guess = static_cast<float>(double_guess);
  if (float_guess == double_guess) {
    // This shortcut triggers for integer values.
    return float_guess;
  }

  // We must catch double-rounding. Say the double has been rounded up, and is
  // now a boundary of a float, and rounds up again. This is why we have to
  // look at previous too.
  // Example (in decimal numbers):
  //    input: 12349
  //    high-precision (4 digits): 1235
  //    low-precision (3 digits):
  //       when read from input: 123
  //       when rounded from high precision: 124.
  // To do this we simply look at the neigbors of the correct result and see
  // if they would round to the same float. If the guess is not correct we have
  // to look at four values (since two different doubles could be the correct
  // double).

  double double_next = Double(double_guess).NextDouble();
  double double_previous = Double(double_guess).PreviousDouble();

  float f1 = static_cast<float>(double_previous);
  float f2 = float_guess;
  float f3 = static_cast<float>(double_next);
  float f4;
  if (is_correct) {
    f4 = f3;
  } else {
    double double_next2 = Double(double_next).NextDouble();
    f4 = static_cast<float>(double_next2);
  }
  (void) f2;  // Mark variable as used.
  ASSERT(f1 <= f2 && f2 <= f3 && f3 <= f4);

  // If the guess doesn't lie near a single-precision boundary we can simply
  // return its float-value.
  if (f1 == f4) {
    return float_guess;
  }

  ASSERT((f1 != f2 && f2 == f3 && f3 == f4) ||
         (f1 == f2 && f2 != f3 && f3 == f4) ||
         (f1 == f2 && f2 == f3 && f3 != f4));

  // guess and next are the two possible canditates (in the same way that
  // double_guess was the lower candidate for a double-precision guess).
  float guess = f1;
  float next = f4;
  DiyFp upper_boundary;
  if (guess == 0.0f) {
    float min_float = 1e-45f;
    upper_boundary = Double(static_cast<double>(min_float) / 2).AsDiyFp();
  } else {
    upper_boundary = Single(guess).UpperBoundary();
  }
  int comparison = CompareBufferWithDiyFp(trimmed, exponent, upper_boundary);
  if (comparison < 0) {
    return guess;
  } else if (comparison > 0) {
    return next;
  } else if ((Single(guess).Significand() & 1) == 0) {
    // Round towards even.
    return guess;
  } else {
    return next;
  }
}